

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O1

void dmrC_allocator_destroy(allocator *A)

{
  allocation_blob *__ptr;
  allocation_blob *paVar1;
  
  __ptr = A->blobs_;
  A->blobs_ = (allocation_blob *)0x0;
  A->freelist_ = (void *)0x0;
  A->allocations = 0;
  A->total_bytes = 0;
  A->useful_bytes = 0;
  while (__ptr != (allocation_blob *)0x0) {
    paVar1 = __ptr->next;
    free(__ptr);
    __ptr = paVar1;
  }
  A->blobs_ = (allocation_blob *)0x0;
  A->total_bytes = 0;
  A->useful_bytes = 0;
  A->freelist_ = (void *)0x0;
  A->allocations = 0;
  return;
}

Assistant:

void dmrC_allocator_destroy(struct allocator *A) {
  dmrC_allocator_drop_all_allocations(A);
  A->blobs_ = NULL;
  A->allocations = 0;
  A->total_bytes = 0;
  A->useful_bytes = 0;
  A->freelist_ = NULL;
}